

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OBJWriter.cc
# Opt level: O1

size_t __thiscall OpenMesh::IO::_OBJWriter_::getMaterial(_OBJWriter_ *this,Vec4f _color)

{
  pointer *ppVVar1;
  pointer pVVar2;
  iterator __position;
  ulong uVar3;
  float *pfVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  undefined1 auStack_28 [8];
  Vec4f _color_local;
  
  pVVar2 = (this->materialA_).
           super__Vector_base<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->materialA_).
       super__Vector_base<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)__position._M_current - (long)pVVar2;
  bVar7 = lVar5 != 0;
  if (bVar7) {
    uVar6 = lVar5 >> 4;
    auStack_28._0_4_ = _color.super_VectorDataT<float,_4>.field_0._0_4_;
    auStack_28._4_4_ = _color.super_VectorDataT<float,_4>.field_0._4_4_;
    _color_local.super_VectorDataT<float,_4>.field_0.m128[0] =
         _color.super_VectorDataT<float,_4>.field_0._8_4_;
    _color_local.super_VectorDataT<float,_4>.field_0.m128[1] =
         _color.super_VectorDataT<float,_4>.field_0._12_4_;
    pfVar4 = (pVVar2->super_VectorDataT<float,_4>).field_0.m128 + 3;
    uVar3 = 0;
    do {
      if ((pfVar4[-3] == (float)auStack_28._0_4_) &&
         (!NAN(pfVar4[-3]) && !NAN((float)auStack_28._0_4_))) {
        if ((pfVar4[-2] == (float)auStack_28._4_4_) &&
           (!NAN(pfVar4[-2]) && !NAN((float)auStack_28._4_4_))) {
          if ((pfVar4[-1] == _color_local.super_VectorDataT<float,_4>.field_0.m128[0]) &&
             (!NAN(pfVar4[-1]) && !NAN(_color_local.super_VectorDataT<float,_4>.field_0.m128[0]))) {
            if ((*pfVar4 == _color_local.super_VectorDataT<float,_4>.field_0.m128[1]) &&
               (!NAN(*pfVar4) && !NAN(_color_local.super_VectorDataT<float,_4>.field_0.m128[1]))) {
              if (bVar7) {
                return uVar3;
              }
              break;
            }
          }
        }
      }
      uVar3 = uVar3 + 1;
      bVar7 = uVar3 < uVar6;
      pfVar4 = pfVar4 + 4;
    } while (uVar6 + (uVar6 == 0) != uVar3);
  }
  if (__position._M_current ==
      (this->materialA_).
      super__Vector_base<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    auStack_28 = (undefined1  [8])_color.super_VectorDataT<float,_4>.field_0._0_8_;
    _color_local.super_VectorDataT<float,_4>.field_0._0_8_ =
         _color.super_VectorDataT<float,_4>.field_0._8_8_;
    std::vector<OpenMesh::VectorT<float,4>,std::allocator<OpenMesh::VectorT<float,4>>>::
    _M_realloc_insert<OpenMesh::VectorT<float,4>const&>
              ((vector<OpenMesh::VectorT<float,4>,std::allocator<OpenMesh::VectorT<float,4>>> *)
               &this->materialA_,__position,(VectorT<float,_4> *)auStack_28);
  }
  else {
    *(long *)&((__position._M_current)->super_VectorDataT<float,_4>).field_0 =
         _color.super_VectorDataT<float,_4>.field_0._0_8_;
    *(long *)((long)&((__position._M_current)->super_VectorDataT<float,_4>).field_0 + 8) =
         _color.super_VectorDataT<float,_4>.field_0._8_8_;
    ppVVar1 = &(this->materialA_).
               super__Vector_base<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return ((long)(this->materialA_).
                super__Vector_base<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->materialA_).
                super__Vector_base<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
}

Assistant:

size_t _OBJWriter_::getMaterial(OpenMesh::Vec4f _color) const
{
  for (size_t i=0; i < materialA_.size(); i++)
    if(materialA_[i] == _color)
      return i;

  //not found add new material
  materialA_.push_back( _color );
  return materialA_.size()-1;
}